

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

bool __thiscall cmake::SaveCache(cmake *this,string *path)

{
  bool bVar1;
  long lVar2;
  allocator local_51;
  string local_50;
  
  bVar1 = cmState::SaveCache(this->State,path);
  lVar2 = 0;
  do {
    std::__cxx11::string::string
              ((string *)&local_50,*(char **)((long)SaveCache::entries + lVar2),&local_51);
    UnwatchUnusedCli(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  return bVar1;
}

Assistant:

bool cmake::SaveCache(const std::string& path)
{
  bool result = this->State->SaveCache(path);
  static const char* entries[] = {"CMAKE_CACHE_MAJOR_VERSION",
                                  "CMAKE_CACHE_MINOR_VERSION",
                                  "CMAKE_CACHE_PATCH_VERSION",
                                  "CMAKE_CACHEFILE_DIR"};
  for (const char* const* nameIt = cmArrayBegin(entries);
       nameIt != cmArrayEnd(entries); ++nameIt)
    {
    this->UnwatchUnusedCli(*nameIt);
    }
  return result;
}